

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::SetDeferredColumns(Codec *this)

{
  ushort uVar1;
  PeelColumn *pPVar2;
  uint64_t *puVar3;
  PeelRefs *pPVar4;
  ulong uVar5;
  uint16_t column_i;
  uint16_t ge_column_i_1;
  uint16_t count_1;
  uint16_t added_i;
  uint16_t row_i;
  uint count;
  uint i;
  PeelRefs *refs;
  uint64_t ge_mask;
  uint64_t *matrix_row_offset;
  uint16_t defer_i;
  uint16_t ge_column_i;
  PeelColumn *column;
  Codec *this_local;
  
  ge_column_i = 0;
  for (defer_i = this->_defer_head_columns; defer_i != 0xffff; defer_i = pPVar2[defer_i].Next) {
    pPVar2 = this->_peel_cols;
    puVar3 = this->_compress_matrix;
    pPVar4 = this->_peel_col_refs;
    i = 0;
    uVar1 = pPVar4[defer_i].RowCount;
    for (; i < uVar1; i = i + 1) {
      uVar5 = (ulong)(this->_ge_pitch * (uint)pPVar4[defer_i].Rows[i]);
      puVar3[(long)((int)(uint)ge_column_i >> 6) + uVar5] =
           1L << ((byte)ge_column_i & 0x3f) | puVar3[(long)((int)(uint)ge_column_i >> 6) + uVar5];
    }
    this->_ge_col_map[ge_column_i] = defer_i;
    pPVar2[defer_i].field_1.Weight2Refs = ge_column_i;
    ge_column_i = ge_column_i + 1;
  }
  added_i = 0;
  uVar1 = this->_mix_count;
  for (; added_i < uVar1; added_i = added_i + 1) {
    this->_ge_col_map[(ushort)(this->_defer_count + added_i)] = this->_block_count + added_i;
  }
  return;
}

Assistant:

void Codec::SetDeferredColumns()
{
    CAT_IF_DUMP(cout << endl << "---- SetDeferredColumns ----" << endl << endl;)

    PeelColumn * GF256_RESTRICT column;

    // For each deferred column:
    for (uint16_t ge_column_i = 0, defer_i = _defer_head_columns;
        defer_i != LIST_TERM;
        defer_i = column->Next, ++ge_column_i)
    {
        column = &_peel_cols[defer_i];

        CAT_IF_DUMP(cout << "GE column " << ge_column_i <<
            " mapped to matrix column " << defer_i << " :";)

        // Get pointer to this matrix row
        uint64_t *matrix_row_offset = _compress_matrix + (ge_column_i >> 6);

        // Get word mask for this column bit
        const uint64_t ge_mask = (uint64_t)1 << (ge_column_i & 63);

        // Get references for this deferred index
        const PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[defer_i];

        // For each affected row:
        for (unsigned i = 0, count = refs->RowCount; i < count; ++i)
        {
            const uint16_t row_i = refs->Rows[i];

            CAT_IF_DUMP(cout << " " << row_i;)

            matrix_row_offset[_ge_pitch * row_i] |= ge_mask;
        }

        CAT_IF_DUMP(cout << endl;)

        // Set column map for this GE column
        _ge_col_map[ge_column_i] = defer_i;

        // Set reverse mapping also
        column->GEColumn = ge_column_i;
    }

    // Set column map for each mix column:
    for (uint16_t added_i = 0, count = _mix_count; added_i < count; ++added_i)
    {
        CAT_DEBUG_ASSERT((unsigned)_defer_count + (unsigned)added_i < 65536);
        CAT_DEBUG_ASSERT((unsigned)_block_count + (unsigned)added_i < 65536);
        const uint16_t ge_column_i = _defer_count + added_i;
        const uint16_t column_i = _block_count + added_i;

        CAT_IF_DUMP(cout << "GE column(mix) " << ge_column_i <<
            " mapped to matrix column " << column_i << endl;)

        _ge_col_map[ge_column_i] = column_i;
    }
}